

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sid.cc
# Opt level: O3

double SID::I0(double x)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  iVar1 = 1;
  dVar3 = 1.0;
  dVar2 = 1.0;
  do {
    dVar4 = (double)iVar1;
    iVar1 = iVar1 + 1;
    dVar4 = (x * 0.5) / dVar4;
    dVar3 = dVar3 * dVar4 * dVar4;
    dVar2 = dVar2 + dVar3;
  } while (dVar2 * 1e-06 <= dVar3);
  return dVar2;
}

Assistant:

double SID::I0(double x)
{
  // Max error acceptable in I0.
  const double I0e = 1e-6;

  double sum, u, halfx, temp;
  int n;

  sum = u = n = 1;
  halfx = x/2.0;

  do {
    temp = halfx/n++;
    u *= temp*temp;
    sum += u;
  } while (u >= I0e*sum);

  return sum;
}